

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdBitmask<wabt::interp::Simd<short,(unsigned_char)8>>(Thread *this)

{
  short *psVar1;
  byte local_25;
  uint local_24;
  undefined1 auStack_20 [3];
  u8 i;
  u32 result;
  Simd<short,_(unsigned_char)__b_> val;
  Thread *this_local;
  
  val.v._8_8_ = this;
  _auStack_20 = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  local_24 = 0;
  for (local_25 = 0; local_25 < 8; local_25 = local_25 + 1) {
    psVar1 = Simd<short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<short,_(unsigned_char)__b_> *)auStack_20,local_25);
    if (*psVar1 < 0) {
      local_24 = 1 << (local_25 & 0x1f) | local_24;
    }
  }
  Push<unsigned_int>(this,local_24);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitmask() {
  auto val = Pop<S>();
  u32 result = 0;
  for (u8 i = 0; i < S::lanes; ++i) {
    if (val[i] < 0) {
      result |= 1 << i;
    }
  }
  Push(result);
  return RunResult::Ok;
}